

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O0

void __thiscall ezc3d::c3d::frame(c3d *this,Frame *f,size_t idx,bool skipInternalUpdates)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  const_reference pvVar5;
  size_t sVar6;
  runtime_error *prVar7;
  size_type sVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  vector<double,_std::allocator<double>_> *this_00;
  Header *this_01;
  size_t sVar11;
  byte in_CL;
  size_t nAnalogByFrames;
  size_t nChannel;
  size_t subSize;
  size_t nAnalogs;
  invalid_argument *anon_var_0;
  size_t i_1;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *namesParameter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  size_t nPoints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001a00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00001a08;
  c3d *in_stack_00001a10;
  string *in_stack_fffffffffffffba8;
  pointer pbVar12;
  Group *in_stack_fffffffffffffbb0;
  pointer pbVar13;
  Frame *in_stack_fffffffffffffbb8;
  Data *in_stack_fffffffffffffbc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  Parameter *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc98;
  Analogs *in_stack_fffffffffffffca0;
  bool local_329;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  c3d *in_stack_fffffffffffffda8;
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [32];
  size_t local_1d0;
  byte local_1c3;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0 [37];
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  string local_198 [37];
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  string local_170 [37];
  byte local_14b;
  byte local_14a;
  allocator<char> local_149;
  string local_148 [40];
  ulong local_120;
  ulong local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f8;
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [32];
  size_t local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::__shared_ptr_access<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<ezc3d::DataNS::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x14c156);
  DataNS::Data::frame(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                      (size_t)in_stack_fffffffffffffbb0);
  if ((local_19 & 1) == 0) {
    parameters((c3d *)0x14c18a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::Parameters::group
              ((Parameters *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::GroupNS::Group::parameter(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsInt(in_stack_fffffffffffffbe0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    sVar6 = (size_t)*pvVar5;
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_28 = sVar6;
    if (sVar6 != 0) {
      DataNS::Frame::points((Frame *)0x14c2c9);
      sVar6 = DataNS::Points3dNS::Points::nbPoints((Points *)0x14c2d1);
      if (sVar6 != local_28) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar7,
                   "Number of points in POINT:USED parameter must equal to the number of points sent in the frame"
                  );
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    parameters((c3d *)0x14c3e2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::Parameters::group
              ((Parameters *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::GroupNS::Group::parameter(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    ParametersNS::GroupNS::Parameter::valuesAsString_abi_cxx11_(in_stack_fffffffffffffbe0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pointNames_abi_cxx11_(in_stack_fffffffffffffda8);
    local_f8 = &local_110;
    for (local_118 = 0; uVar2 = local_118,
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_a0), uVar2 < sVar8; local_118 = local_118 + 1) {
      for (local_120 = 0; uVar2 = local_120,
          sVar8 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_f8), uVar2 < sVar8; local_120 = local_120 + 1) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_f8,local_120);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_a0,local_120);
        iVar3 = std::__cxx11::string::compare((string *)pvVar9);
        if (iVar3 == 0) break;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbc0);
    local_14a = 0;
    local_14b = 0;
    local_172 = 0;
    local_173 = 0;
    DataNS::Frame::points((Frame *)0x14c7db);
    sVar6 = DataNS::Points3dNS::Points::nbPoints((Points *)0x14c7f2);
    local_329 = false;
    if (sVar6 != 0) {
      parameters((c3d *)0x14c824);
      std::allocator<char>::allocator();
      local_14a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      local_14b = 1;
      ParametersNS::Parameters::group
                ((Parameters *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::allocator<char>::allocator();
      local_172 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      local_173 = 1;
      ParametersNS::GroupNS::Group::parameter(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      in_stack_fffffffffffffca0 =
           (Analogs *)ParametersNS::GroupNS::Parameter::valuesAsDouble(in_stack_fffffffffffffbe0);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,0);
      local_329 = *pvVar10 == 0.0;
    }
    if ((local_173 & 1) != 0) {
      std::__cxx11::string::~string(local_170);
    }
    if ((local_172 & 1) != 0) {
      std::allocator<char>::~allocator(&local_171);
    }
    if ((local_14b & 1) != 0) {
      std::__cxx11::string::~string(local_148);
    }
    if ((local_14a & 1) != 0) {
      std::allocator<char>::~allocator(&local_149);
    }
    if ((local_329 & 1U) != 0) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"Point frame rate must be specified if you add some")
      ;
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_19a = 0;
    local_19b = 0;
    local_1c2 = 0;
    local_1c3 = 0;
    DataNS::Frame::analogs((Frame *)0x14cb2e);
    sVar6 = DataNS::AnalogsNS::Analogs::nbSubframes((Analogs *)0x14cb45);
    bVar1 = false;
    if (sVar6 != 0) {
      parameters((c3d *)0x14cb77);
      std::allocator<char>::allocator();
      local_19a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      local_19b = 1;
      ParametersNS::Parameters::group
                ((Parameters *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::allocator<char>::allocator();
      local_1c2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                 (allocator<char> *)in_stack_fffffffffffffbe0);
      local_1c3 = 1;
      ParametersNS::GroupNS::Group::parameter(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      this_00 = ParametersNS::GroupNS::Parameter::valuesAsDouble(in_stack_fffffffffffffbe0);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      bVar1 = *pvVar10 == 0.0;
    }
    if ((local_1c3 & 1) != 0) {
      std::__cxx11::string::~string(local_1c0);
    }
    if ((local_1c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c1);
    }
    if ((local_19b & 1) != 0) {
      std::__cxx11::string::~string(local_198);
    }
    if ((local_19a & 1) != 0) {
      std::allocator<char>::~allocator(&local_199);
    }
    if (bVar1) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar7,"Analog frame rate must be specified if you add some");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    parameters((c3d *)0x14ce48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::Parameters::group
              ((Parameters *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
               (allocator<char> *)in_stack_fffffffffffffbe0);
    ParametersNS::GroupNS::Group::parameter(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    pvVar4 = ParametersNS::GroupNS::Parameter::valuesAsInt(in_stack_fffffffffffffbe0);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,0);
    sVar6 = (size_t)*pvVar5;
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator(&local_219);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator(&local_1f1);
    local_1d0 = sVar6;
    DataNS::Frame::analogs((Frame *)0x14cf5a);
    sVar6 = DataNS::AnalogsNS::Analogs::nbSubframes((Analogs *)0x14cf6b);
    if (sVar6 != 0) {
      DataNS::Frame::analogs((Frame *)0x14cf9b);
      DataNS::AnalogsNS::Analogs::subframe
                (in_stack_fffffffffffffca0,CONCAT17(local_329,in_stack_fffffffffffffc98));
      sVar6 = DataNS::AnalogsNS::SubFrame::nbChannels((SubFrame *)0x14cfc1);
      this_01 = header((c3d *)0x14cfe2);
      sVar11 = Header::nbAnalogByFrame(this_01);
      if (((local_1d0 != 0) || (sVar11 != 0)) && (sVar6 != local_1d0)) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar7,
                   "Number of analogs in ANALOG:USED parameter must equal the number of analogs sent in the frame"
                  );
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    pbVar12 = (pointer)0x0;
    pbVar13 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14d14f);
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_02 = &local_278;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar12;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14d179);
    updateParameters(in_stack_00001a10,in_stack_00001a08,in_stack_00001a00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_02);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_02);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_02);
  }
  return;
}

Assistant:

void ezc3d::c3d::frame(const ezc3d::DataNS::Frame &f, size_t idx,
                       bool skipInternalUpdates) {

  // Replace the jth frame
  _data->frame(f, idx);

  if (skipInternalUpdates)
    return;

  // Make sure f.points().points() is the same as data.f[ANY].points()
  size_t nPoints(static_cast<size_t>(
      parameters().group("POINT").parameter("USED").valuesAsInt()[0]));
  if (nPoints != 0 && f.points().nbPoints() != nPoints)
    throw std::runtime_error(
        "Number of points in POINT:USED parameter must equal to "
        "the number of points sent in the frame");

  std::vector<std::string> labels(
      parameters().group("POINT").parameter("LABELS").valuesAsString());

  try {
    // Check if all the labels are in the actual LABELSX parameter
    const std::vector<std::string> &namesParameter(pointNames());
    for (size_t i = 0; i < labels.size(); ++i) {
      for (size_t i = 0; i < namesParameter.size(); ++i) {
        if (!namesParameter[i].compare(labels[i])) {
          break;
        }
      }
    }
  } catch (const std::invalid_argument&) {
    throw std::invalid_argument("All the points in the frame must appear "
                                "in the POINT:LABELS parameter");
  }

  if (f.points().nbPoints() > 0 &&
      parameters().group("POINT").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Point frame rate must be specified if you add some");
  }
  if (f.analogs().nbSubframes() > 0 &&
      parameters().group("ANALOG").parameter("RATE").valuesAsDouble()[0] ==
          0.0) {
    throw std::runtime_error(
        "Analog frame rate must be specified if you add some");
  }

  size_t nAnalogs(static_cast<size_t>(
      parameters().group("ANALOG").parameter("USED").valuesAsInt()[0]));
  size_t subSize(f.analogs().nbSubframes());
  if (subSize != 0) {
    size_t nChannel(f.analogs().subframe(0).nbChannels());
    size_t nAnalogByFrames(header().nbAnalogByFrame());
    if (!(nAnalogs == 0 && nAnalogByFrames == 0) && nChannel != nAnalogs)
      throw std::runtime_error(
          "Number of analogs in ANALOG:USED parameter must equal "
          "the number of analogs sent in the frame");
  }

  // Finalize the internal structure
  updateParameters();
}